

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode parse_connect_to_slist(Curl_easy *data,connectdata *conn,curl_slist *conn_to_host)

{
  byte *pbVar1;
  curl_trc_feat *pcVar2;
  altsvcinfo *asi;
  Curl_easy *data_00;
  byte bVar3;
  _Bool _Var4;
  http_majors hVar5;
  int iVar6;
  uint uVar7;
  size_t max;
  byte *pbVar8;
  char *pcVar9;
  ConnectBits CVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  ConnectBits CVar14;
  CURLcode CVar15;
  byte *__s;
  ulong uVar16;
  byte *pbVar17;
  bool bVar18;
  bool bVar19;
  curl_off_t portparse;
  Curl_easy *local_48;
  char *local_40;
  char *local_38;
  
  local_48 = data;
  if (conn_to_host == (curl_slist *)0x0) {
    bVar18 = true;
    bVar19 = false;
LAB_00162a91:
    if (((!bVar19) && (asi = data->asi, asi != (altsvcinfo *)0x0)) &&
       (((bVar18 &&
         ((conn->handler->protocol == 2 && (portparse = 0, ((data->state).http_neg.wanted & 1) != 0)
          ))) && (((data->state).http_neg.field_0x3 & 8) == 0)))) {
      pcVar9 = (conn->host).rawalloc;
      _Var4 = Curl_altsvc_lookup(asi,ALPN_h1,pcVar9,conn->remote_port,(altsvc **)&portparse,
                                 (uint)(data->state).http_neg.allowed << 3 & (uint)asi->flags & 8);
      if (_Var4) {
        pcVar11 = (*Curl_cstrdup)(*(char **)(portparse + 0x10));
        if (pcVar11 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (conn->conn_to_host).rawalloc = pcVar11;
        (conn->conn_to_host).name = pcVar11;
        CVar10 = conn->bits;
        conn->bits = (ConnectBits)((ulong)CVar10 | 0x100);
        conn->conn_to_port = (uint)*(ushort *)(portparse + 0x18);
        conn->bits = (ConnectBits)((ulong)CVar10 | 0x380);
        if ((((data->set).field_0x89f & 0x40) != 0) &&
           ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))
           )) {
          pcVar12 = Curl_alpnid2str(ALPN_h1);
          uVar7 = conn->remote_port;
          pcVar13 = Curl_alpnid2str(*(alpnid *)(portparse + 0x1c));
          data = local_48;
          Curl_infof(local_48,"Alt-svc connecting from [%s]%s:%d to [%s]%s:%d",pcVar12,pcVar9,
                     (ulong)uVar7,pcVar13,pcVar11,(ulong)*(ushort *)(portparse + 0x18));
        }
        if (*(int *)(portparse + 0x1c) == 0x10) {
          hVar5 = '\x02';
        }
        else {
          if (*(int *)(portparse + 0x1c) != 0x20) {
            return CURLE_OK;
          }
          conn->transport = '\x05';
          hVar5 = '\x04';
        }
        (data->state).http_neg.allowed = hVar5;
        (data->state).http_neg.wanted = hVar5;
      }
    }
    return CURLE_OK;
  }
LAB_0016266e:
  pcVar9 = conn_to_host->data;
  if (*pcVar9 == ':') {
    local_40 = pcVar9 + 1;
LAB_00162714:
    if (*local_40 == ':') {
      local_40 = local_40 + 1;
    }
    else {
      pcVar9 = strchr(local_40,0x3a);
      if (((pcVar9 == (char *)0x0) ||
          (iVar6 = Curl_str_number(&local_40,&portparse,0xffff), iVar6 != 0)) ||
         (local_40 = pcVar9 + 1, portparse != conn->remote_port)) goto LAB_001628ff;
    }
    if (*local_40 == '\0') goto LAB_001628ff;
    pbVar8 = (byte *)(*Curl_cstrdup)(local_40);
    data_00 = local_48;
    if (pbVar8 == (byte *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    __s = pbVar8;
    pbVar17 = pbVar8;
    if (*pbVar8 == 0x5b) {
      pbVar17 = pbVar8 + 1;
      bVar3 = pbVar8[1];
      __s = pbVar17;
      while (bVar3 != 0) {
        if ((9 < (byte)(bVar3 - 0x30)) &&
           ((0x38 < bVar3 - 0x2e ||
            ((0x1f8000001f81001U >> ((ulong)(bVar3 - 0x2e) & 0x3f) & 1) == 0)))) {
          if (bVar3 != 0x25) goto LAB_00162a7a;
          uVar7 = (uint)__s[1];
          iVar6 = __s[1] - 0x32;
          if (iVar6 == 0) {
            iVar6 = 0x35 - (uint)__s[2];
          }
          else {
            iVar6 = -iVar6;
          }
          __s = __s + 1;
          if (((local_48 != (Curl_easy *)0x0) && (iVar6 != 0)) &&
             ((((local_48->set).field_0x89f & 0x40) != 0 &&
              ((pcVar2 = (local_48->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
               (0 < pcVar2->log_level)))))) {
            Curl_infof(local_48,"Please URL encode %% as %%25, see RFC 6874.");
            uVar7 = (uint)*__s;
          }
          goto LAB_00162a40;
        }
        pbVar1 = __s + 1;
        __s = __s + 1;
        bVar3 = *pbVar1;
      }
      goto LAB_0016279e;
    }
    goto LAB_001627d0;
  }
  bVar19 = (*(uint *)&conn->bits >> 10 & 1) == 0;
  pcVar11 = "[";
  if (bVar19) {
    pcVar11 = "";
  }
  pcVar12 = "]";
  if (bVar19) {
    pcVar12 = "";
  }
  pcVar11 = curl_maprintf("%s%s%s",pcVar11,(conn->host).name,pcVar12);
  if (pcVar11 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  max = strlen(pcVar11);
  iVar6 = curl_strnequal(pcVar9,pcVar11,max);
  (*Curl_cfree)(pcVar11);
  data = local_48;
  if ((iVar6 != 0) && (local_40 = pcVar9 + max + 1, pcVar9[max] == ':')) goto LAB_00162714;
LAB_001628ff:
  CVar10 = conn->bits;
  uVar16 = 0xffffffff;
  pcVar9 = (char *)0x0;
  goto LAB_0016290e;
LAB_00162a40:
  bVar3 = (byte)uVar7;
  if (bVar3 == 0) goto LAB_0016279e;
  if ((((9 < (byte)(bVar3 - 0x30)) && (0x19 < (byte)((bVar3 & 0xdf) + 0xbf))) && (1 < uVar7 - 0x2d))
     && ((uVar7 != 0x7e && (uVar7 != 0x5f)))) goto LAB_00162a7a;
  uVar7 = (uint)__s[1];
  __s = __s + 1;
  goto LAB_00162a40;
LAB_00162a7a:
  if (bVar3 == 0x5d) {
    *__s = 0;
    __s = __s + 1;
  }
  else {
LAB_0016279e:
    if (((data_00 != (Curl_easy *)0x0) && (((data_00->set).field_0x89f & 0x40) != 0)) &&
       ((pcVar2 = (data_00->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
       ) {
      Curl_infof(data_00,"Invalid IPv6 address format");
    }
  }
LAB_001627d0:
  pcVar9 = strchr((char *)__s,0x3a);
  uVar16 = 0xffffffff;
  if ((pcVar9 != (char *)0x0) && (*pcVar9 = '\0', pcVar9[1] != '\0')) {
    local_38 = pcVar9 + 1;
    iVar6 = Curl_str_number(&local_38,&portparse,0xffff);
    if (iVar6 != 0) {
      Curl_failf(local_48,"No valid port number in connect to host string (%s)",pcVar9 + 1);
      CVar15 = CURLE_SETOPT_OPTION_SYNTAX;
      goto LAB_00162c41;
    }
    uVar16 = portparse & 0xffffffff;
  }
  iVar6 = (int)uVar16;
  pcVar9 = (*Curl_cstrdup)((char *)pbVar17);
  if (pcVar9 == (char *)0x0) {
    CVar15 = CURLE_OUT_OF_MEMORY;
LAB_00162c41:
    (*Curl_cfree)(pbVar8);
    return CVar15;
  }
  (*Curl_cfree)(pbVar8);
  data = local_48;
  CVar10 = conn->bits;
  if (*pcVar9 == '\0') {
LAB_0016290e:
    conn->bits = (ConnectBits)((ulong)CVar10 & 0xfffffffffffffeff);
    (*Curl_cfree)(pcVar9);
    pcVar9 = (char *)0x0;
LAB_0016292a:
    CVar14 = conn->bits;
    iVar6 = (int)uVar16;
    if (-1 < iVar6) {
      conn->conn_to_port = iVar6;
      conn->bits = (ConnectBits)((ulong)CVar14 | 0x200);
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        Curl_infof(data,"Connecting to port: %d",uVar16);
      }
      goto LAB_001629b4;
    }
  }
  else {
    CVar14 = (ConnectBits)((ulong)CVar10 | 0x100);
    (conn->conn_to_host).rawalloc = pcVar9;
    (conn->conn_to_host).name = pcVar9;
    conn->bits = CVar14;
    if (local_48 != (Curl_easy *)0x0) {
      if ((((local_48->set).field_0x89f & 0x40) != 0) &&
         ((pcVar2 = (local_48->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
          (0 < pcVar2->log_level)))) {
        Curl_infof(local_48,"Connecting to hostname: %s",pcVar9);
      }
      goto LAB_0016292a;
    }
    if (-1 < iVar6) {
      conn->conn_to_port = iVar6;
      conn->bits = (ConnectBits)((ulong)CVar10 | 0x300);
      goto LAB_001629b4;
    }
  }
  conn->bits = (ConnectBits)((ulong)CVar14 & 0xfffffffffffffdff);
  iVar6 = -1;
LAB_001629b4:
  bVar18 = iVar6 == -1;
  bVar19 = pcVar9 != (char *)0x0;
  if (((bVar19) || (conn_to_host = conn_to_host->next, conn_to_host == (curl_slist *)0x0)) ||
     (iVar6 != -1)) goto LAB_00162a91;
  goto LAB_0016266e;
}

Assistant:

static CURLcode parse_connect_to_slist(struct Curl_easy *data,
                                       struct connectdata *conn,
                                       struct curl_slist *conn_to_host)
{
  CURLcode result = CURLE_OK;
  char *host = NULL;
  int port = -1;

  while(conn_to_host && !host && port == -1) {
    result = parse_connect_to_string(data, conn, conn_to_host->data,
                                     &host, &port);
    if(result)
      return result;

    if(host && *host) {
      conn->conn_to_host.rawalloc = host;
      conn->conn_to_host.name = host;
      conn->bits.conn_to_host = TRUE;

      infof(data, "Connecting to hostname: %s", host);
    }
    else {
      /* no "connect to host" */
      conn->bits.conn_to_host = FALSE;
      Curl_safefree(host);
    }

    if(port >= 0) {
      conn->conn_to_port = port;
      conn->bits.conn_to_port = TRUE;
      infof(data, "Connecting to port: %d", port);
    }
    else {
      /* no "connect to port" */
      conn->bits.conn_to_port = FALSE;
      port = -1;
    }

    conn_to_host = conn_to_host->next;
  }

#ifndef CURL_DISABLE_ALTSVC
  if(data->asi && !host && (port == -1) &&
     ((conn->handler->protocol == CURLPROTO_HTTPS) ||
#ifdef DEBUGBUILD
      /* allow debug builds to circumvent the HTTPS restriction */
      getenv("CURL_ALTSVC_HTTP")
#else
      0
#endif
       )) {
    /* no connect_to match, try alt-svc! */
    enum alpnid srcalpnid = ALPN_none;
    bool hit = FALSE;
    struct altsvc *as = NULL;
    int allowed_alpns = ALPN_none;
    struct http_negotiation *neg = &data->state.http_neg;

    DEBUGF(infof(data, "Alt-svc check wanted=%x, allowed=%x",
                 neg->wanted, neg->allowed));
#ifdef USE_HTTP3
    if(neg->allowed & CURL_HTTP_V3x)
      allowed_alpns |= ALPN_h3;
#endif
#ifdef USE_HTTP2
    if(neg->allowed & CURL_HTTP_V2x)
      allowed_alpns |= ALPN_h2;
#endif
    if(neg->allowed & CURL_HTTP_V1x)
      allowed_alpns |= ALPN_h1;
    allowed_alpns &= (int)data->asi->flags;

    host = conn->host.rawalloc;
    DEBUGF(infof(data, "check Alt-Svc for host %s", host));
#ifdef USE_HTTP3
    if(!hit && (neg->wanted & CURL_HTTP_V3x)) {
      srcalpnid = ALPN_h3;
      hit = Curl_altsvc_lookup(data->asi,
                               ALPN_h3, host, conn->remote_port, /* from */
                               &as /* to */,
                               allowed_alpns);
    }
 #endif
 #ifdef USE_HTTP2
    if(!hit && (neg->wanted & CURL_HTTP_V2x) &&
       !neg->h2_prior_knowledge) {
      srcalpnid = ALPN_h2;
      hit = Curl_altsvc_lookup(data->asi,
                               ALPN_h2, host, conn->remote_port, /* from */
                               &as /* to */,
                               allowed_alpns);
    }
 #endif
    if(!hit && (neg->wanted & CURL_HTTP_V1x) &&
       !neg->only_10) {
      srcalpnid = ALPN_h1;
      hit = Curl_altsvc_lookup(data->asi,
                               ALPN_h1, host, conn->remote_port, /* from */
                               &as /* to */,
                               allowed_alpns);
    }

    if(hit) {
      char *hostd = strdup((char *)as->dst.host);
      if(!hostd)
        return CURLE_OUT_OF_MEMORY;
      conn->conn_to_host.rawalloc = hostd;
      conn->conn_to_host.name = hostd;
      conn->bits.conn_to_host = TRUE;
      conn->conn_to_port = as->dst.port;
      conn->bits.conn_to_port = TRUE;
      conn->bits.altused = TRUE;
      infof(data, "Alt-svc connecting from [%s]%s:%d to [%s]%s:%d",
            Curl_alpnid2str(srcalpnid), host, conn->remote_port,
            Curl_alpnid2str(as->dst.alpnid), hostd, as->dst.port);
      if(srcalpnid != as->dst.alpnid) {
        /* protocol version switch */
        switch(as->dst.alpnid) {
        case ALPN_h1:
          neg->wanted = neg->allowed = CURL_HTTP_V1x;
          neg->only_10 = FALSE;
          break;
        case ALPN_h2:
          neg->wanted = neg->allowed = CURL_HTTP_V2x;
          break;
        case ALPN_h3:
          conn->transport = TRNSPRT_QUIC;
          neg->wanted = neg->allowed = CURL_HTTP_V3x;
          break;
        default: /* should not be possible */
          break;
        }
      }
    }
  }
#endif

  return result;
}